

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  TimeUnitsDeclarationSyntax *pTVar1;
  DeepCloneVisitor visitor;
  Token local_58;
  Token local_48;
  Token local_38;
  DividerClauseSyntax *local_28;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x70) == (SyntaxNode *)0x0) {
    local_28 = (DividerClauseSyntax *)0x0;
  }
  else {
    local_28 = (DividerClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x70),(DeepCloneVisitor *)&local_38,
                          (BumpAllocator *)__child_stack);
  }
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  pTVar1 = BumpAllocator::
           emplace<slang::syntax::TimeUnitsDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::DividerClauseSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_48,&local_58,&local_28,&local_38);
  return (int)pTVar1;
}

Assistant:

static SyntaxNode* clone(const TimeUnitsDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<TimeUnitsDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.time.deepClone(alloc),
        node.divider ? deepClone(*node.divider, alloc) : nullptr,
        node.semi.deepClone(alloc)
    );
}